

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

APlayerPawn * P_SpawnPlayer(FPlayerStart *mthing,int playernum,int flags)

{
  userinfo_t *this;
  DWORD *pDVar1;
  player_t *this_00;
  double dVar2;
  byte bVar3;
  BYTE *pBVar4;
  APlayerPawn *other;
  double dVar5;
  WORD type;
  bool bVar6;
  FPlayerSkin *pFVar7;
  int ii_1;
  uint uVar8;
  int iVar9;
  long lVar10;
  AActor *pAVar11;
  APlayerPawn *pAVar12;
  APlayerPawn *pAVar13;
  AInventory *pAVar14;
  DThinker *pDVar15;
  PClassActor *type_00;
  int i;
  AActor **obj;
  int ii;
  ulong uVar16;
  long lVar17;
  double local_80;
  DVector3 local_68;
  DAngle local_50;
  TThinkerIterator<AActor> it;
  
  if ((7 < (uint)playernum || mthing == (FPlayerStart *)0x0) ||
     (uVar16 = (ulong)(uint)playernum, playeringame[uVar16] != true)) {
    return (APlayerPawn *)0x0;
  }
  if (consoleplayer == playernum) {
    P_PredictionLerpReset();
  }
  lVar10 = uVar16 * 0x2a0;
  this_00 = (player_t *)(&players + uVar16 * 0x54);
  type_00 = (PClassActor *)(&DAT_009ba470)[uVar16 * 0x54];
  if (type_00 == (PClassActor *)0x0) {
    if (PlayerClasses.Count < 2) {
      (&DAT_009ba4c0)[lVar10] = 0;
      uVar8 = 0;
    }
    else {
      if ((deathmatch.Value == 0) || (multiplayer == false)) {
        uVar8 = (uint)*(byte *)(SinglePlayerClass + uVar16);
      }
      else {
        uVar8 = userinfo_t::GetPlayerClassNum((userinfo_t *)(&DAT_009ba458 + lVar10));
        if ((int)uVar8 < 0) {
          uVar8 = FRandom::operator()(&pr_multiclasschoice);
          uVar8 = uVar8 % PlayerClasses.Count;
        }
      }
      (&DAT_009ba4c0)[lVar10] = (char)uVar8;
      uVar8 = uVar8 & 0xff;
    }
    type_00 = *(PClassActor **)((long)&(PlayerClasses.Array)->Type + (ulong)(uVar8 << 5));
    (&DAT_009ba470)[uVar16 * 0x54] = type_00;
  }
  if ((((((dmflags2.Value._1_1_ & 0x10) == 0) || ((&DAT_009ba428)[lVar10] != '\x02')) ||
       (deathmatch.Value != 0)) ||
      ((gameaction == ga_worlddone || (this_00->mo == (APlayerPawn *)0x0)))) ||
     ((((this_00->mo->super_AActor).Sector)->Flags & 8) != 0)) {
LAB_004c127d:
    local_68.X = (mthing->pos).X;
    local_68.Y = (mthing->pos).Y;
    local_80 = (double)(int)mthing->angle;
    if (((byte)i_compatflags2 & 1) != 0) {
      local_80 = local_80 + 0.01;
    }
    pBVar4 = (type_00->super_PClass).Defaults;
    if ((pBVar4[0x18d] & 1) == 0) {
      if ((pBVar4[400] & 0x40) == 0) {
        local_68.Z = -2147483648.0;
      }
      else {
        local_68.Z = 2147483646.0;
      }
    }
    else {
      local_68.Z = 2147483647.0;
    }
  }
  else {
    pAVar11 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba550 + lVar10));
    if (pAVar11 == (AActor *)0x0) {
      type_00 = (PClassActor *)(&DAT_009ba470)[uVar16 * 0x54];
      goto LAB_004c127d;
    }
    pAVar12 = this_00->mo;
    type_00 = (PClassActor *)(&DAT_009ba470)[uVar16 * 0x54];
    if (999999 < ((pAVar12->super_AActor).Sector)->damageamount) goto LAB_004c127d;
    local_68.Z = (pAVar12->super_AActor).__Pos.Z;
    local_68.X = (pAVar12->super_AActor).__Pos.X;
    local_68.Y = (pAVar12->super_AActor).__Pos.Y;
    local_80 = (pAVar12->super_AActor).Angles.Yaw.Degrees;
  }
  pAVar12 = (APlayerPawn *)Spawn(type_00,&local_68,NO_REPLACE);
  if ((level.flags._3_1_ & 8) != 0) {
    if ((local_68.Z != -2147483648.0) || (NAN(local_68.Z))) {
      if ((local_68.Z == 2147483647.0) && (!NAN(local_68.Z))) {
        dVar5 = (pAVar12->super_AActor).__Pos.Z - (mthing->pos).Z;
        goto LAB_004c1341;
      }
    }
    else {
      dVar5 = (mthing->pos).Z + (pAVar12->super_AActor).__Pos.Z;
LAB_004c1341:
      (pAVar12->super_AActor).__Pos.Z = dVar5;
    }
    P_FindFloorCeiling((AActor *)pAVar12,0xe);
  }
  (pAVar12->super_AActor).FriendPlayer = (char)playernum + '\x01';
  other = this_00->mo;
  this_00->mo = pAVar12;
  (pAVar12->super_AActor).player = this_00;
  bVar3 = (&DAT_009ba428)[lVar10];
  if ((bVar3 & 0xfe) == 2) {
    G_PlayerReborn(playernum);
  }
  else if (((other != (APlayerPawn *)0x0) && ((flags & 1U) == 0)) &&
          ((other->super_AActor).player == this_00)) {
    AActor::ObtainInventory((AActor *)pAVar12,&other->super_AActor);
    FBehavior::StaticStopMyScripts(&other->super_AActor);
  }
  pFVar7 = skins;
  this = (userinfo_t *)(&DAT_009ba458 + lVar10);
  iVar9 = userinfo_t::GetSkin(this);
  iVar9 = R_FindSkin(pFVar7[iVar9].name,(uint)(byte)(&DAT_009ba4c0)[lVar10]);
  userinfo_t::SkinNumChanged(this,iVar9);
  if (((pAVar12->super_AActor).flags2.Value & 0x10000) == 0) {
    R_BuildPlayerTranslation(playernum);
    (pAVar12->super_AActor).Translation = playernum | 0x10000;
  }
  (pAVar12->super_AActor).Angles.Yaw.Degrees = local_80;
  (pAVar12->super_AActor).Angles.Roll.Degrees = 0.0;
  (pAVar12->super_AActor).Angles.Pitch.Degrees = 0.0;
  (pAVar12->super_AActor).health = (&DAT_009ba4b8)[uVar16 * 0xa8];
  pFVar7 = skins;
  if (((pAVar12->super_AActor).flags4.Value & 0x20) == 0) {
    iVar9 = userinfo_t::GetSkin(this);
    (pAVar12->super_AActor).sprite = (WORD)pFVar7[iVar9].sprite;
  }
  *(undefined8 *)(&DAT_009ba478 + uVar16 * 0xa8) = 0x42b4000042b40000;
  pAVar13 = this_00->mo;
  (&DAT_009ba598)[uVar16 * 0x54] = pAVar13;
  (&DAT_009ba428)[lVar10] = 0;
  *(undefined2 *)(&DAT_009ba510 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba524 + lVar10) = 0;
  (&DAT_009ba560)[uVar16 * 0xa8] = 0;
  *(undefined8 *)(&DAT_009ba568 + lVar10) = 0;
  *(undefined4 *)(&DAT_009ba570 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba578 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba558 + lVar10) = 0xffffffff00000000;
  (&DAT_009ba488)[uVar16 * 0x54] = pAVar12->ViewHeight;
  (&DAT_009ba512)[uVar16 * 0x150] = 0;
  *(undefined8 *)(&DAT_009ba550 + lVar10) = 0;
  *(undefined2 *)(&DAT_009ba4ec + lVar10) = 0;
  *(undefined4 *)(&DAT_009ba4e8 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba5c0 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba5c8 + lVar10) = 0;
  APlayerPawn::ResetAirSupply(pAVar13,false);
  player_t::Uncrouch(this_00);
  *(undefined8 *)(&DAT_009ba5a8 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba5d8 + lVar10) = 0;
  *(undefined8 *)(&DAT_009ba5e0 + lVar10) = 0;
  (&DAT_009ba5b0)[lVar10] = 0xff;
  *(undefined8 *)(&DAT_009ba4a0 + lVar10) = 0;
  *(undefined8 *)(lVar10 + 0x9ba4a8) = 0;
  obj = (AActor **)&DAT_009ba598;
  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
    if ((playeringame[lVar17] == true) &&
       (pAVar13 = (APlayerPawn *)GC::ReadBarrier<AActor>(obj), pAVar13 == other)) {
      *obj = (AActor *)pAVar12;
    }
    obj = obj + 0x54;
  }
  if (((demoplayback != false) || (demonew == true)) && (chasedemo.Value == true)) {
    *(undefined4 *)(&DAT_009ba508 + lVar10) = 0x20;
  }
  if ((flags & 1U) == 0) {
    P_SetupPsprites(this_00,SUB41((flags & 2U) >> 1,0));
  }
  if (deathmatch.Value == 0) {
    if (multiplayer == false) {
      if ((other != (APlayerPawn *)0x0 && bVar3 == 2) && (level.flags2._2_1_ & 2) != 0)
      goto LAB_004c1619;
      goto LAB_004c15ca;
    }
    if (other == (APlayerPawn *)0x0 || bVar3 != 2) goto LAB_004c15ca;
LAB_004c1619:
    (*(this_00->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])
              (this_00->mo,other);
LAB_004c1628:
    AActor::DestroyAllInventory(&other->super_AActor);
    bVar6 = false;
  }
  else {
    (*(this_00->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2b])();
LAB_004c15ca:
    if (other != (APlayerPawn *)0x0) goto LAB_004c1628;
    bVar6 = true;
  }
  if ((((bVar3 & 0xfe) == 2) && ((dmflags2.Value._1_1_ & 4) != 0)) &&
     ((multiplayer != false || (alwaysapplydmflags.Value == true)))) {
    pAVar14 = AActor::GiveInventoryType
                        (&this_00->mo->super_AActor,
                         (PClassActor *)APowerInvulnerable::RegistrationInfo.MyClass);
    *(undefined8 *)&pAVar14->field_0x4dc = 0x69;
    *(byte *)&pAVar14->ItemFlags = (byte)pAVar14->ItemFlags | 0x20;
    pDVar1 = &(this_00->mo->super_AActor).effects;
    *pDVar1 = *pDVar1 | 0x20;
  }
  if ((StatusBar != (DBaseStatusBar *)0x0) &&
     ((consoleplayer == playernum ||
      (iVar9 = DBaseStatusBar::GetPlayer(StatusBar), iVar9 == playernum)))) {
    (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,this_00);
  }
  if (multiplayer == true) {
    local_50.Degrees = (pAVar12->super_AActor).Angles.Yaw.Degrees;
    AActor::Vec3Angle((DVector3 *)&it,(AActor *)pAVar12,20.0,&local_50,0.0,false);
    P_SpawnTeleportFog((AActor *)pAVar12,(DVector3 *)&it,false,true);
  }
  dVar5 = (pAVar12->super_AActor).ceilingz;
  dVar2 = (pAVar12->super_AActor).Height;
  if (dVar5 < (pAVar12->super_AActor).__Pos.Z + dVar2) {
    (pAVar12->super_AActor).__Pos.Z = dVar5 - dVar2;
  }
  if ((flags & 1U) != 0) {
    return pAVar12;
  }
  if (bVar3 != 3) {
    if (bVar3 != 0) {
      if (bVar3 != 2) {
        return pAVar12;
      }
      if (bVar6) {
        __assert_fail("oldactor != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_mobj.cpp"
                      ,0x1272,"APlayerPawn *P_SpawnPlayer(FPlayerStart *, int, int)");
      }
      TThinkerIterator<AActor>::TThinkerIterator
                ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,0x80);
      while (pDVar15 = FThinkerIterator::Next(&it.super_FThinkerIterator),
            pDVar15 != (DThinker *)0x0) {
        pAVar13 = (APlayerPawn *)GC::ReadBarrier<AActor>((AActor **)&pDVar15[8].NextThinker);
        if (pAVar13 == other) {
          pDVar15[8].NextThinker = (DThinker *)0x0;
        }
      }
      lVar17 = 0x108;
      for (lVar10 = 0; lVar10 < numsectors; lVar10 = lVar10 + 1) {
        pAVar13 = (APlayerPawn *)
                  GC::ReadBarrier<AActor>
                            ((AActor **)((long)&sectors->planes[0].xform.xOffs + lVar17));
        if (pAVar13 == other) {
          *(undefined8 *)((long)&sectors->planes[0].xform.xOffs + lVar17) = 0;
        }
        lVar17 = lVar17 + 0x268;
      }
      DObject::StaticPointerSubstitution((DObject *)other,(DObject *)this_00->mo);
      pAVar13 = this_00->mo;
      for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
        if ((APlayerPawn *)bodyque[lVar10] == pAVar13) {
          bodyque[lVar10] = &other->super_AActor;
        }
      }
      type = 2;
      goto LAB_004c1833;
    }
    if (savegamerestore != false) {
      return pAVar12;
    }
  }
  pAVar13 = this_00->mo;
  type = 4;
LAB_004c1833:
  FBehavior::StaticStartTypedScripts(type,&pAVar13->super_AActor,true,0,false);
  return pAVar12;
}

Assistant:

APlayerPawn *P_SpawnPlayer (FPlayerStart *mthing, int playernum, int flags)
{
	player_t *p;
	APlayerPawn *mobj, *oldactor;
	BYTE	  state;
	DVector3 spawn;
	DAngle SpawnAngle;

	if (mthing == NULL)
	{
		return NULL;
	}
	// not playing?
	if ((unsigned)playernum >= (unsigned)MAXPLAYERS || !playeringame[playernum])
		return NULL;

	// Old lerp data needs to go
	if (playernum == consoleplayer)
	{
		P_PredictionLerpReset();
	}

	p = &players[playernum];

	if (p->cls == NULL)
	{
		// [GRB] Pick a class from player class list
		if (PlayerClasses.Size () > 1)
		{
			int type;

			if (!deathmatch || !multiplayer)
			{
				type = SinglePlayerClass[playernum];
			}
			else
			{
				type = p->userinfo.GetPlayerClassNum();
				if (type < 0)
				{
					type = pr_multiclasschoice() % PlayerClasses.Size ();
				}
			}
			p->CurrentPlayerClass = type;
		}
		else
		{
			p->CurrentPlayerClass = 0;
		}
		p->cls = PlayerClasses[p->CurrentPlayerClass].Type;
	}

	if (( dmflags2 & DF2_SAME_SPAWN_SPOT ) &&
		( p->playerstate == PST_REBORN ) &&
		( deathmatch == false ) &&
		( gameaction != ga_worlddone ) &&
		( p->mo != NULL ) && 
		( !(p->mo->Sector->Flags & SECF_NORESPAWN) ) &&
		( NULL != p->attacker ) &&							// don't respawn on damaging floors
		( p->mo->Sector->damageamount < TELEFRAG_DAMAGE ))	// this really should be a bit smarter...
	{
		spawn = p->mo->Pos();
		SpawnAngle = p->mo->Angles.Yaw;
	}
	else
	{
		spawn.X = mthing->pos.X;
		spawn.Y = mthing->pos.Y;

		// Allow full angular precision
		SpawnAngle = (double)mthing->angle;
		if (i_compatflags2 & COMPATF2_BADANGLES)
		{
			SpawnAngle += 0.01;
		}

		if (GetDefaultByType(p->cls)->flags & MF_SPAWNCEILING)
			spawn.Z = ONCEILINGZ;
		else if (GetDefaultByType(p->cls)->flags2 & MF2_SPAWNFLOAT)
			spawn.Z = FLOATRANDZ;
		else
			spawn.Z = ONFLOORZ;
	}

	mobj = static_cast<APlayerPawn *>
		(Spawn (p->cls, spawn, NO_REPLACE));

	if (level.flags & LEVEL_USEPLAYERSTARTZ)
	{
		if (spawn.Z == ONFLOORZ)
			mobj->AddZ(mthing->pos.Z);
		else if (spawn.Z == ONCEILINGZ)
			mobj->AddZ(-mthing->pos.Z);
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	mobj->FriendPlayer = playernum + 1;	// [RH] players are their own friends
	oldactor = p->mo;
	p->mo = mobj;
	mobj->player = p;
	state = p->playerstate;
	if (state == PST_REBORN || state == PST_ENTER)
	{
		G_PlayerReborn (playernum);
	}
	else if (oldactor != NULL && oldactor->player == p && !(flags & SPF_TEMPPLAYER))
	{
		// Move the voodoo doll's inventory to the new player.
		mobj->ObtainInventory (oldactor);
		FBehavior::StaticStopMyScripts (oldactor);	// cancel all ENTER/RESPAWN scripts for the voodoo doll
	}

	// [GRB] Reset skin
	p->userinfo.SkinNumChanged(R_FindSkin (skins[p->userinfo.GetSkin()].name, p->CurrentPlayerClass));

	if (!(mobj->flags2 & MF2_DONTTRANSLATE))
	{
		// [RH] Be sure the player has the right translation
		R_BuildPlayerTranslation (playernum);

		// [RH] set color translations for player sprites
		mobj->Translation = TRANSLATION(TRANSLATION_Players,playernum);
	}

	mobj->Angles.Yaw = SpawnAngle;
	mobj->Angles.Pitch = mobj->Angles.Roll = 0.;
	mobj->health = p->health;

	// [RH] Set player sprite based on skin
	if (!(mobj->flags4 & MF4_NOSKIN))
	{
		mobj->sprite = skins[p->userinfo.GetSkin()].sprite;
	}

	p->DesiredFOV = p->FOV = 90.f;
	p->camera = p->mo;
	p->playerstate = PST_LIVE;
	p->refire = 0;
	p->damagecount = 0;
	p->bonuscount = 0;
	p->morphTics = 0;
	p->MorphedPlayerClass = 0;
	p->MorphStyle = 0;
	p->MorphExitFlash = NULL;
	p->extralight = 0;
	p->fixedcolormap = NOFIXEDCOLORMAP;
	p->fixedlightlevel = -1;
	p->viewheight = mobj->ViewHeight;
	p->inconsistant = 0;
	p->attacker = NULL;
	p->spreecount = 0;
	p->multicount = 0;
	p->lastkilltime = 0;
	p->BlendR = p->BlendG = p->BlendB = p->BlendA = 0.f;
	p->mo->ResetAirSupply(false);
	p->Uncrouch();
	p->MinPitch = p->MaxPitch = 0.;	// will be filled in by PostBeginPlay()/netcode
	p->MUSINFOactor = NULL;
	p->MUSINFOtics = -1;

	p->Vel.Zero();	// killough 10/98: initialize bobbing to 0.

	for (int ii = 0; ii < MAXPLAYERS; ++ii)
	{
		if (playeringame[ii] && players[ii].camera == oldactor)
		{
			players[ii].camera = mobj;
		}
	}

	// [RH] Allow chasecam for demo watching
	if ((demoplayback || demonew) && chasedemo)
		p->cheats = CF_CHASECAM;

	// setup gun psprite
	if (!(flags & SPF_TEMPPLAYER))
	{ // This can also start a script so don't do it for the dummy player.
		P_SetupPsprites (p, !!(flags & SPF_WEAPONFULLYUP));
	}

	if (deathmatch)
	{ // Give all cards in death match mode.
		p->mo->GiveDeathmatchInventory ();
	}
	else if ((multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN)) && state == PST_REBORN && oldactor != NULL)
	{ // Special inventory handling for respawning in coop
		p->mo->FilterCoopRespawnInventory (oldactor);
	}
	if (oldactor != NULL)
	{ // Remove any inventory left from the old actor. Coop handles
	  // it above, but the other modes don't.
		oldactor->DestroyAllInventory();
	}
	// [BC] Handle temporary invulnerability when respawned
	if ((state == PST_REBORN || state == PST_ENTER) &&
		(dmflags2 & DF2_YES_RESPAWN_INVUL) &&
		(multiplayer || alwaysapplydmflags))
	{
		APowerup *invul = static_cast<APowerup*>(p->mo->GiveInventoryType (RUNTIME_CLASS(APowerInvulnerable)));
		invul->EffectTics = 3*TICRATE;
		invul->BlendColor = 0;			// don't mess with the view
		invul->ItemFlags |= IF_UNDROPPABLE;	// Don't drop this
		p->mo->effects |= FX_RESPAWNINVUL;	// [RH] special effect
	}

	if (StatusBar != NULL && (playernum == consoleplayer || StatusBar->GetPlayer() == playernum))
	{
		StatusBar->AttachToPlayer (p);
	}

	if (multiplayer)
	{
		P_SpawnTeleportFog(mobj, mobj->Vec3Angle(20., mobj->Angles.Yaw, 0.), false, true);
	}

	// "Fix" for one of the starts on exec.wad MAP01: If you start inside the ceiling,
	// drop down below it, even if that means sinking into the floor.
	if (mobj->Top() > mobj->ceilingz)
	{
		mobj->SetZ(mobj->ceilingz - mobj->Height, false);
	}

	// [BC] Do script stuff
	if (!(flags & SPF_TEMPPLAYER))
	{
		if (state == PST_ENTER || (state == PST_LIVE && !savegamerestore))
		{
			FBehavior::StaticStartTypedScripts (SCRIPT_Enter, p->mo, true);
		}
		else if (state == PST_REBORN)
		{
			assert (oldactor != NULL);

			// before relocating all pointers to the player all sound targets
			// pointing to the old actor have to be NULLed. Otherwise all
			// monsters who last targeted this player will wake up immediately
			// after the player has respawned.
			AActor *th;
			TThinkerIterator<AActor> it;
			while ((th = it.Next()))
			{
				if (th->LastHeard == oldactor) th->LastHeard = NULL;
			}
			for(int i = 0; i < numsectors; i++)
			{
				if (sectors[i].SoundTarget == oldactor) sectors[i].SoundTarget = NULL;
			}

			DObject::StaticPointerSubstitution (oldactor, p->mo);
			// PointerSubstitution() will also affect the bodyque, so undo that now.
			for (int ii=0; ii < BODYQUESIZE; ++ii)
				if (bodyque[ii] == p->mo)
					bodyque[ii] = oldactor;
			FBehavior::StaticStartTypedScripts (SCRIPT_Respawn, p->mo, true);
		}
	}
	return mobj;
}